

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

int __thiscall
Imf_3_2::TypedAttribute<Imf_3_2::Glorp>::copy
          (TypedAttribute<Imf_3_2::Glorp> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Attribute *this_00;
  TypedAttribute<Imf_3_2::Glorp> *pTVar1;
  
  this_00 = (Attribute *)operator_new(0x10);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  Imf_3_2::Attribute::Attribute(this_00);
  *(undefined ***)this_00 = &PTR__Attribute_001ed138;
  *(undefined8 *)(this_00 + 8) = 0;
  pTVar1 = cast(&this->super_Attribute);
  *(Glorp *)(this_00 + 8) = pTVar1->_value;
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}